

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall Engine_testAddIntegerNoTags_Test::TestBody(Engine_testAddIntegerNoTags_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  Engine e;
  string *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 uVar4;
  Measure<int> *in_stack_fffffffffffffda8;
  int line;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  undefined1 uVar5;
  undefined8 in_stack_fffffffffffffdb8;
  Type type;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  undefined1 uVar6;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  char *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  long local_218;
  Message *message;
  AssertHelper *this_01;
  AssertionResult local_1c8 [2];
  undefined4 local_1a4;
  AssertionResult local_1a0 [2];
  undefined4 local_17c;
  AssertionResult local_178 [2];
  undefined4 local_154;
  AssertionResult local_150 [2];
  AssertionResult local_130 [4];
  vector<Tag,_std::allocator<Tag>_> local_e8;
  uint local_cc;
  size_type local_b8;
  undefined4 local_ac;
  AssertionResult local_a8;
  long local_98;
  const_reference local_90;
  undefined4 local_88;
  allocator local_81;
  string local_80 [48];
  Message local_50;
  AssertHelper local_48;
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  message = &local_50;
  std::make_unique<TestHandler>();
  this_01 = &local_48;
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"foo",&local_81);
  local_88 = 100000000;
  Engine::Add<int,_nullptr>
            ((Engine *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,(int *)0x11a71e);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  this_00 = Engine::GetHandlers(&local_40);
  local_90 = std::
             vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  if (pHVar2 == (pointer)0x0) {
    local_218 = 0;
  }
  else {
    local_218 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_98 = local_218;
  local_ac = 1;
  local_b8 = std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::size
                       ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_218 + 8));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffda8,
             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (int *)in_stack_fffffffffffffd98,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    testing::AssertionResult::failure_message((AssertionResult *)0x11a8f9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),type,
               (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    testing::Message::~Message((Message *)0x11a956);
  }
  local_cc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a9c4);
  if (local_cc == 0) {
    std::vector<Measure<int>,_std::allocator<Measure<int>_>_>::operator[]
              ((vector<Measure<int>,_std::allocator<Measure<int>_>_> *)(local_98 + 8),0);
    Measure<int>::Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffda8);
    testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffda8,
               (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               (char (*) [9])in_stack_fffffffffffffd98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      testing::AssertionResult::failure_message((AssertionResult *)0x11aaaa);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),type,
                 (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      testing::internal::AssertHelper::operator=(this_01,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      testing::Message::~Message((Message *)0x11ab07);
    }
    local_cc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ab75);
    if (local_cc == 0) {
      local_154 = 0;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffda8,
                 (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (MetricType *)in_stack_fffffffffffffd98,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
      uVar6 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffdc0));
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x11ac27);
        type = (Type)((ulong)pcVar3 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdc0),type,
                   (char *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                   (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
        testing::internal::AssertHelper::operator=(this_01,message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
        testing::Message::~Message((Message *)0x11ac84);
      }
      local_cc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x11acf2);
      if (local_cc == 0) {
        local_17c = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffda8,
                   (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   (int *)in_stack_fffffffffffffd98,
                   (float *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
        uVar5 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdc0));
          in_stack_fffffffffffffda8 =
               (Measure<int> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x11ada4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdc0),type,
                     (char *)CONCAT17(uVar5,in_stack_fffffffffffffdb0),
                     (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
          testing::internal::AssertHelper::operator=(this_01,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
          testing::Message::~Message((Message *)0x11ae01);
        }
        local_cc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ae6f);
        if (local_cc == 0) {
          local_1a4 = 100000000;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)in_stack_fffffffffffffda8,
                     (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                     (int *)in_stack_fffffffffffffd98,
                     (int *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
          uVar4 = bVar1;
          if (!bVar1) {
            testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdc0));
            in_stack_fffffffffffffd98 =
                 (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x11af21);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdc0),type,
                       (char *)CONCAT17(uVar5,in_stack_fffffffffffffdb0),
                       (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (char *)CONCAT17(uVar4,in_stack_fffffffffffffda0));
            testing::internal::AssertHelper::operator=(this_01,message);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90)
                      );
            testing::Message::~Message((Message *)0x11af7e);
          }
          local_cc = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x11afec);
          if (local_cc == 0) {
            std::vector<Tag,_std::allocator<Tag>_>::size(&local_e8);
            testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffda8,
                       (char *)CONCAT17(uVar4,in_stack_fffffffffffffda0),
                       (int *)in_stack_fffffffffffffd98,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88);
            line = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
            in_stack_fffffffffffffd97 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)CONCAT17(uVar6,in_stack_fffffffffffffdc0));
              testing::AssertionResult::failure_message((AssertionResult *)0x11b0b8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffdc0),type,
                         (char *)CONCAT17(uVar5,in_stack_fffffffffffffdb0),line,
                         (char *)CONCAT17(uVar4,in_stack_fffffffffffffda0));
              testing::internal::AssertHelper::operator=(this_01,message);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
              testing::Message::~Message((Message *)0x11b113);
            }
            local_cc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b17e);
            if (local_cc == 0) {
              local_cc = 0;
            }
          }
        }
      }
    }
    Measure<int>::~Measure
              ((Measure<int> *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  return;
}

Assistant:

TEST(Engine, testAddIntegerNoTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 100000000);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100000000, im.value);
    ASSERT_EQ(0, im.tags.size());
}